

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O0

size_t __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::
arrayStart(ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
           *this)

{
  int iVar1;
  type pDVar2;
  undefined4 extraout_var;
  long in_RDI;
  size_t result;
  size_t in_stack_00000038;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000040;
  Kind in_stack_00000284;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000288;
  
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(in_stack_00000288,in_stack_00000284)
  ;
  pDVar2 = boost::shared_ptr<avro::Decoder>::operator->((shared_ptr<avro::Decoder> *)(in_RDI + 8));
  iVar1 = (*pDVar2->_vptr_Decoder[0x10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::popRepeater(in_stack_00000040);
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance
              (in_stack_00000288,in_stack_00000284);
  }
  else {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::setRepeatCount
              (in_stack_00000040,in_stack_00000038);
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t ResolvingDecoderImpl<P>::arrayStart()
{
    parser_.advance(Symbol::sArrayStart);
    size_t result = base_->arrayStart();
    if (result == 0) {
        parser_.popRepeater();
        parser_.advance(Symbol::sArrayEnd);
    } else {
        parser_.setRepeatCount(result);
    }
    return result;
}